

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
ExceptionOr(ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
            *this,OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *value)

{
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *t;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *value_local;
  ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this_local;
  
  ExceptionOrValue::ExceptionOrValue(&this->super_ExceptionOrValue);
  t = mv<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>(value);
  Maybe<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::Maybe
            (&this->value,t);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}